

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lparser.c
# Opt level: O0

void labelstat(LexState *ls,TString *name,int line)

{
  int last;
  bool bVar1;
  int line_local;
  TString *name_local;
  LexState *ls_local;
  
  checknext(ls,0x11f);
  while( true ) {
    bVar1 = true;
    if ((ls->t).token != 0x3b) {
      bVar1 = (ls->t).token == 0x11f;
    }
    if (!bVar1) break;
    statement(ls);
  }
  checkrepeated(ls,name);
  last = block_follow(ls,0);
  createlabel(ls,name,line,last);
  return;
}

Assistant:

static void labelstat (LexState *ls, TString *name, int line) {
  /* label -> '::' NAME '::' */
  checknext(ls, TK_DBCOLON);  /* skip double colon */
  while (ls->t.token == ';' || ls->t.token == TK_DBCOLON)
    statement(ls);  /* skip other no-op statements */
  checkrepeated(ls, name);  /* check for repeated labels */
  createlabel(ls, name, line, block_follow(ls, 0));
}